

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O3

void do_cmd_birth_init(command *cmd)

{
  ulong uVar1;
  short sVar2;
  int iVar3;
  bool bVar4;
  player *p;
  char *__s;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  player_race *r;
  player_class *c;
  int *piVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  char roman_token_chr1 [8];
  undefined8 local_60;
  char local_58 [40];
  
  p = player;
  character_dungeon = false;
  sVar2 = player->ht_birth;
  if (sVar2 == 0) {
    r = player_id2race(0);
    c = player_id2class(0);
    player_generate(p,r,c,false);
    goto LAB_001a0b41;
  }
  pcVar15 = player->full_name;
  __s = find_roman_suffix_start(pcVar15);
  if (__s != (char *)0x0) {
    builtin_strncpy(local_58,"MDCLXVI",8);
    if (*__s == '\0') {
LAB_001a0b1e:
      *__s = '\0';
LAB_001a0b22:
      msg("Sorry, could not deal with suffix");
    }
    else {
      sVar5 = strlen(__s);
      if (sVar5 == 0) {
        *__s = '\0';
        iVar12 = 0;
      }
      else {
        uVar14 = 0;
        iVar12 = 0;
        local_60 = sVar5;
        do {
          pcVar6 = strchr(local_58,(int)__s[uVar14]);
          if (pcVar6 == (char *)0x0) goto LAB_001a0b1e;
          uVar1 = uVar14 + 1;
          uVar11 = (ulong)((int)pcVar6 - (int)local_58);
          if (((0x54UL >> (uVar11 & 0x3f) & 1) == 0) || (__s[uVar1] == '\0')) {
            lVar8 = 0;
            uVar14 = uVar1;
          }
          else {
            pcVar6 = *(char **)(&DAT_002ce7e0 + uVar11 * 8);
            pcVar7 = strchr(pcVar6,(int)__s[uVar1]);
            sVar5 = local_60;
            if (pcVar7 == (char *)0x0) {
              lVar8 = 0;
              uVar14 = uVar1;
            }
            else {
              lVar8 = (long)(((int)pcVar7 - (int)pcVar6) + 1);
              uVar14 = uVar14 + 2;
            }
          }
          iVar12 = iVar12 + *(int *)(&DAT_00272230 + lVar8 * 4 + uVar11 * 0xc);
        } while (uVar14 < sVar5);
        local_58[0x10] = 'C';
        local_58[0x11] = '\0';
        local_58[0x12] = 'L';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = 'X';
        local_58[0x16] = 'L';
        local_58[0x17] = '\0';
        local_58[0x18] = 'X';
        local_58[0x19] = '\0';
        local_58[0x1a] = '\0';
        local_58[0x1b] = 'I';
        local_58[0x1c] = 'X';
        local_58[0x1d] = '\0';
        local_58[0x1e] = 'V';
        local_58[0] = 'M';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = 'C';
        local_58[4] = 'M';
        local_58[5] = '\0';
        local_58[6] = 'D';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = 'C';
        local_58[10] = 'D';
        local_58[0xb] = '\0';
        local_58[0xc] = 'C';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = 'X';
        local_58[0x1f] = 0;
        local_58[0x20] = '\0';
        local_58[0x21] = 'I';
        local_58[0x22] = 'V';
        local_58[0x23] = '\0';
        local_58[0x24] = 'I';
        local_58[0x25] = '\0';
        local_58[0x26] = '\0';
        *__s = '\0';
        if (iVar12 < 0) goto LAB_001a0b22;
      }
      local_58[8] = '\0';
      local_58[9] = 'C';
      local_58[10] = 'D';
      local_58[0xb] = '\0';
      local_58[0xc] = 'C';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = 'X';
      local_58[0] = 'M';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = 'C';
      local_58[4] = 'M';
      local_58[5] = '\0';
      local_58[6] = 'D';
      local_58[7] = '\0';
      local_58[0x20] = '\0';
      local_58[0x21] = 'I';
      local_58[0x22] = 'V';
      local_58[0x23] = '\0';
      local_58[0x24] = 'I';
      local_58[0x25] = '\0';
      local_58[0x26] = '\0';
      local_58[0x1f] = 0;
      local_58[0x18] = 'X';
      local_58[0x19] = '\0';
      local_58[0x1a] = '\0';
      local_58[0x1b] = 'I';
      local_58[0x1c] = 'X';
      local_58[0x1d] = '\0';
      local_58[0x1e] = 'V';
      local_58[0x10] = 'C';
      local_58[0x11] = '\0';
      local_58[0x12] = 'L';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = 'X';
      local_58[0x16] = 'L';
      local_58[0x17] = '\0';
      pcVar15 = pcVar15 + (0x20 - (long)__s);
      iVar12 = iVar12 + 1;
      do {
        piVar9 = &DAT_002721f0;
        pcVar6 = (char *)((long)&local_60 + 5);
        do {
          iVar3 = *piVar9;
          pcVar6 = pcVar6 + 3;
          piVar9 = piVar9 + 1;
        } while (iVar12 < iVar3);
        sVar5 = strlen(__s);
        sVar10 = strlen(pcVar6);
        if (pcVar15 < (undefined1 *)(sVar10 + sVar5 + 1)) goto LAB_001a0b1e;
        my_strcat(__s,pcVar6,(size_t)pcVar15);
        iVar13 = iVar12 - iVar3;
        bVar4 = iVar3 <= iVar12;
        iVar12 = iVar13;
      } while (iVar13 != 0 && bVar4);
    }
  }
  save_roller_data(&quickstart_prev);
LAB_001a0b41:
  quickstart_allowed = sVar2 != 0;
  event_signal_flag(EVENT_ENTER_BIRTH,(_Bool)quickstart_allowed);
  return;
}

Assistant:

void do_cmd_birth_init(struct command *cmd)
{
	char *buf;

	/* The dungeon is not ready */
	character_dungeon = false;

	/*
	 * If there's a quickstart character, store it for later use.
	 * If not, default to whatever the first of the choices is.
	 */
	if (player->ht_birth) {
		/* Handle incrementing name suffix */
		buf = find_roman_suffix_start(player->full_name);
		if (buf) {
			/* Try to increment the roman suffix */
			int success = int_to_roman(
				roman_to_int(buf) + 1,
				buf,
				sizeof(player->full_name) - (buf - (char *)&player->full_name));

			if (!success) {
				msg("Sorry, could not deal with suffix");
			}
		}

		save_roller_data(&quickstart_prev);
		quickstart_allowed = true;
	} else {
		player_generate(player, player_id2race(0), player_id2class(0), false);
		quickstart_allowed = false;
	}

	/* We're ready to start the birth process */
	event_signal_flag(EVENT_ENTER_BIRTH, quickstart_allowed);
}